

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.c
# Opt level: O1

char * option_type_name(int page)

{
  if ((uint)page < 5) {
    return *(char **)(&DAT_002841e0 + (ulong)(uint)page * 8);
  }
  return "unknown";
}

Assistant:

const char *option_type_name(int page)
{
	const char *result;

	switch (page) {
	case OP_INTERFACE:
		result = "interface";
		break;

	case OP_BIRTH:
		result = "birth";
		break;

	case OP_CHEAT:
		result = "cheat";
		break;

	case OP_SCORE:
		result = "score";
		break;

	case OP_SPECIAL:
		result = "special";
		break;

	default:
		result = "unknown";
		break;
	}

	return result;
}